

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseExpression(State *state)

{
  bool bVar1;
  State *in_RDI;
  State copy;
  State *in_stack_ffffffffffffffc0;
  State *in_stack_ffffffffffffffe8;
  bool local_1;
  
  bVar1 = ParseTemplateParam(in_stack_ffffffffffffffe8);
  if ((bVar1) || (bVar1 = ParseExprPrimary(in_stack_ffffffffffffffe8), bVar1)) {
    local_1 = true;
  }
  else {
    memcpy(&stack0xffffffffffffffc0,in_RDI,0x30);
    bVar1 = ParseOperatorName(in_stack_ffffffffffffffe8);
    if ((bVar1) &&
       (((bVar1 = ParseExpression(in_stack_ffffffffffffffe8), bVar1 &&
         (bVar1 = ParseExpression(in_stack_ffffffffffffffe8), bVar1)) &&
        (bVar1 = ParseExpression(in_stack_ffffffffffffffe8), bVar1)))) {
      local_1 = true;
    }
    else {
      memcpy(in_RDI,&stack0xffffffffffffffc0,0x30);
      bVar1 = ParseOperatorName(in_stack_ffffffffffffffe8);
      if (((bVar1) && (bVar1 = ParseExpression(in_stack_ffffffffffffffe8), bVar1)) &&
         (bVar1 = ParseExpression(in_stack_ffffffffffffffe8), bVar1)) {
        local_1 = true;
      }
      else {
        memcpy(in_RDI,&stack0xffffffffffffffc0,0x30);
        bVar1 = ParseOperatorName(in_stack_ffffffffffffffe8);
        if ((bVar1) && (bVar1 = ParseExpression(in_stack_ffffffffffffffe8), bVar1)) {
          local_1 = true;
        }
        else {
          memcpy(in_RDI,&stack0xffffffffffffffc0,0x30);
          bVar1 = ParseTwoCharToken(in_RDI,"st");
          if ((bVar1) && (bVar1 = ParseType(in_stack_ffffffffffffffe8), bVar1)) {
            local_1 = true;
          }
          else {
            memcpy(in_RDI,&stack0xffffffffffffffc0,0x30);
            bVar1 = ParseTwoCharToken(in_RDI,"sr");
            if ((((bVar1) && (bVar1 = ParseType(in_stack_ffffffffffffffe8), bVar1)) &&
                (bVar1 = ParseUnqualifiedName(in_stack_ffffffffffffffc0), bVar1)) &&
               (bVar1 = ParseTemplateArgs(in_stack_ffffffffffffffe8), bVar1)) {
              local_1 = true;
            }
            else {
              memcpy(in_RDI,&stack0xffffffffffffffc0,0x30);
              bVar1 = ParseTwoCharToken(in_RDI,"sr");
              if (((bVar1) && (bVar1 = ParseType(in_stack_ffffffffffffffe8), bVar1)) &&
                 (bVar1 = ParseUnqualifiedName(in_stack_ffffffffffffffc0), bVar1)) {
                local_1 = true;
              }
              else {
                memcpy(in_RDI,&stack0xffffffffffffffc0,0x30);
                local_1 = false;
              }
            }
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

static bool ParseExpression(State *state) {
  if (ParseTemplateParam(state) || ParseExprPrimary(state)) {
    return true;
  }

  State copy = *state;
  if (ParseOperatorName(state) &&
      ParseExpression(state) &&
      ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseOperatorName(state) &&
      ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseOperatorName(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "st") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseType(state) &&
      ParseUnqualifiedName(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseType(state) &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  *state = copy;
  return false;
}